

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topn_optimizer.cpp
# Opt level: O2

void __thiscall duckdb::TopN::PushdownDynamicFilters(TopN *this,LogicalTopN *op)

{
  vector<duckdb::BoundOrderByNode,_true> *this_00;
  _Head_base<0UL,_duckdb::ConstantFilter_*,_false> _Var1;
  LogicalGet *this_01;
  size_type __n;
  char cVar2;
  _Head_base<0UL,_duckdb::ConstantFilter_*,_false> _Var3;
  pointer pPVar4;
  bool bVar5;
  reference pvVar6;
  pointer pEVar7;
  pointer pEVar8;
  BoundColumnRefExpression *pBVar9;
  reference this_02;
  type op_00;
  DynamicFilterData *pDVar10;
  reference pvVar11;
  vector<duckdb::ColumnIndex,_true> *this_03;
  const_reference col_idx;
  pointer pPVar12;
  ExpressionType comparison_type;
  vector<duckdb::PushdownFilterTarget,_true> pushdown_targets;
  shared_ptr<duckdb::DynamicFilterData,_true> filter_data;
  vector<duckdb::JoinFilterPushdownColumn,_true> columns;
  Value minimum_value;
  ExpressionType local_111;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_110;
  TableFilter *local_108;
  _Head_base<0UL,_duckdb::ConstantFilter_*,_false> local_100;
  vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_> local_f8;
  long *local_e0;
  shared_ptr<duckdb::DynamicFilterData,_true> local_d8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_c8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_a8;
  Value local_88;
  JoinFilterPushdownColumn local_48;
  
  this_00 = &op->orders;
  pvVar6 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_00,0);
  if (pvVar6->null_order != NULLS_FIRST) {
    pvVar6 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_00,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&pvVar6->expression);
    bVar5 = TypeIsIntegral((pEVar7->return_type).physical_type_);
    if ((bVar5) || ((pEVar7->return_type).id_ == VARCHAR)) {
      pvVar6 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_00,0);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pvVar6->expression);
      if ((pEVar8->super_BaseExpression).type == BOUND_COLUMN_REF) {
        pvVar6 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_00,0);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pvVar6->expression);
        pBVar9 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                           (&pEVar8->super_BaseExpression);
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.probe_column_index.table_index = (pBVar9->binding).table_index;
        local_48.probe_column_index.column_index = (pBVar9->binding).column_index;
        ::std::
        vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>::
        emplace_back<duckdb::JoinFilterPushdownColumn&>
                  ((vector<duckdb::JoinFilterPushdownColumn,std::allocator<duckdb::JoinFilterPushdownColumn>>
                    *)&local_c8,&local_48);
        local_f8.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_02 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&(op->super_LogicalOperator).children,0);
        op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*(this_02);
        local_a8._M_impl.super__Vector_impl_data._M_start =
             local_c8._M_impl.super__Vector_impl_data._M_start;
        local_a8._M_impl.super__Vector_impl_data._M_finish =
             local_c8._M_impl.super__Vector_impl_data._M_finish;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        JoinFilterPushdownOptimizer::GetPushdownFilterTargets
                  (op_00,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_a8,
                   (vector<duckdb::PushdownFilterTarget,_true> *)&local_f8);
        ::std::
        _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ::~_Vector_base(&local_a8);
        if (local_f8.
            super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_f8.
            super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pvVar6 = vector<duckdb::BoundOrderByNode,_true>::get<true>(this_00,0);
          cVar2 = ((long)(op->orders).
                         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         .
                         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(op->orders).
                         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         .
                         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_start != 0x18) * '\x02';
          local_111 = cVar2 + COMPARE_GREATERTHAN;
          if (pvVar6->type == ASCENDING) {
            local_111 = cVar2 + COMPARE_LESSTHAN;
          }
          if ((pEVar7->return_type).physical_type_ == VARCHAR) {
            Value::Value(&local_88,anon_var_dwarf_4b4b1b2 + 9);
          }
          else {
            Value::MinimumValue(&local_88,&pEVar7->return_type);
          }
          make_uniq<duckdb::ConstantFilter,duckdb::ExpressionType&,duckdb::Value>
                    ((duckdb *)&local_100,&local_111,&local_88);
          make_shared_ptr<duckdb::DynamicFilterData>();
          pDVar10 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(&local_d8);
          _Var3._M_head_impl = local_100._M_head_impl;
          local_100._M_head_impl = (ConstantFilter *)0x0;
          _Var1._M_head_impl =
               (pDVar10->filter).
               super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
               .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl;
          (pDVar10->filter).
          super_unique_ptr<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ConstantFilter,_std::default_delete<duckdb::ConstantFilter>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ConstantFilter_*,_std::default_delete<duckdb::ConstantFilter>_>
          .super__Head_base<0UL,_duckdb::ConstantFilter_*,_false>._M_head_impl = _Var3._M_head_impl;
          if (_Var1._M_head_impl != (ConstantFilter *)0x0) {
            (**(code **)(*(long *)&(_Var1._M_head_impl)->super_TableFilter + 8))();
          }
          shared_ptr<duckdb::DynamicFilterData,_true>::operator=(&op->dynamic_filter,&local_d8);
          pPVar4 = local_f8.
                   super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pPVar12 = local_f8.
                         super__Vector_base<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>
                         ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar4;
              pPVar12 = pPVar12 + 1) {
            this_01 = pPVar12->get;
            pvVar11 = vector<duckdb::JoinFilterPushdownColumn,_true>::get<true>(&pPVar12->columns,0)
            ;
            __n = (pvVar11->probe_column_index).column_index;
            make_uniq<duckdb::DynamicFilter,duckdb::shared_ptr<duckdb::DynamicFilterData,true>&>
                      ((duckdb *)&local_e0,&local_d8);
            make_uniq<duckdb::OptionalFilter,duckdb::unique_ptr<duckdb::DynamicFilter,std::default_delete<duckdb::DynamicFilter>,true>>
                      ((duckdb *)&local_108,
                       (unique_ptr<duckdb::DynamicFilter,_std::default_delete<duckdb::DynamicFilter>,_true>
                        *)&local_e0);
            this_03 = LogicalGet::GetColumnIds(this_01);
            col_idx = vector<duckdb::ColumnIndex,_true>::get<true>(this_03,__n);
            local_110._M_head_impl = local_108;
            local_108 = (TableFilter *)0x0;
            TableFilterSet::PushFilter
                      (&this_01->table_filters,col_idx,
                       (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&local_110);
            if (local_110._M_head_impl != (TableFilter *)0x0) {
              (*(local_110._M_head_impl)->_vptr_TableFilter[1])();
            }
            local_110._M_head_impl = (TableFilter *)0x0;
            if (local_108 != (TableFilter *)0x0) {
              (*local_108->_vptr_TableFilter[1])();
            }
            if (local_e0 != (long *)0x0) {
              (**(code **)(*local_e0 + 8))();
            }
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_d8.internal.
                      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (local_100._M_head_impl != (ConstantFilter *)0x0) {
            (*((local_100._M_head_impl)->super_TableFilter)._vptr_TableFilter[1])();
          }
          Value::~Value(&local_88);
        }
        ::std::vector<duckdb::PushdownFilterTarget,_std::allocator<duckdb::PushdownFilterTarget>_>::
        ~vector(&local_f8);
        ::std::
        _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ::~_Vector_base(&local_c8);
      }
    }
  }
  return;
}

Assistant:

void TopN::PushdownDynamicFilters(LogicalTopN &op) {
	// pushdown dynamic filters through the Top-N operator
	if (op.orders[0].null_order == OrderByNullType::NULLS_FIRST) {
		// FIXME: not supported for NULLS FIRST quite yet
		// we can support NULLS FIRST by doing (x IS NULL) OR [boundary value]
		return;
	}
	auto &type = op.orders[0].expression->return_type;
	if (!TypeIsIntegral(type.InternalType()) && type.id() != LogicalTypeId::VARCHAR) {
		// only supported for integral types currently
		return;
	}
	if (op.orders[0].expression->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
		// we can only pushdown on ORDER BY [col] currently
		return;
	}
	auto &colref = op.orders[0].expression->Cast<BoundColumnRefExpression>();
	vector<JoinFilterPushdownColumn> columns;
	JoinFilterPushdownColumn column;
	column.probe_column_index = colref.binding;
	columns.emplace_back(column);
	vector<PushdownFilterTarget> pushdown_targets;
	JoinFilterPushdownOptimizer::GetPushdownFilterTargets(*op.children[0], std::move(columns), pushdown_targets);
	if (pushdown_targets.empty()) {
		// no pushdown targets
		return;
	}
	// found pushdown targets! generate dynamic filters
	ExpressionType comparison_type;
	if (op.orders[0].type == OrderType::ASCENDING) {
		// for ascending order, we want the lowest N elements, so we filter on C <= [boundary]
		// if we only have a single order clause, we can filter on C < boundary
		comparison_type =
		    op.orders.size() == 1 ? ExpressionType::COMPARE_LESSTHAN : ExpressionType::COMPARE_LESSTHANOREQUALTO;
	} else {
		// for descending order, we want the highest N elements, so we filter on C >= [boundary]
		// if we only have a single order clause, we can filter on C > boundary
		comparison_type =
		    op.orders.size() == 1 ? ExpressionType::COMPARE_GREATERTHAN : ExpressionType::COMPARE_GREATERTHANOREQUALTO;
	}
	Value minimum_value = type.InternalType() == PhysicalType::VARCHAR ? Value("") : Value::MinimumValue(type);
	auto base_filter = make_uniq<ConstantFilter>(comparison_type, std::move(minimum_value));
	auto filter_data = make_shared_ptr<DynamicFilterData>();
	filter_data->filter = std::move(base_filter);

	// put the filter into the Top-N clause
	op.dynamic_filter = filter_data;

	for (auto &target : pushdown_targets) {
		auto &get = target.get;
		D_ASSERT(target.columns.size() == 1);
		auto col_idx = target.columns[0].probe_column_index.column_index;

		// create the actual dynamic filter
		auto dynamic_filter = make_uniq<DynamicFilter>(filter_data);
		auto optional_filter = make_uniq<OptionalFilter>(std::move(dynamic_filter));

		// push the filter into the table scan
		auto &column_index = get.GetColumnIds()[col_idx];
		get.table_filters.PushFilter(column_index, std::move(optional_filter));
	}
}